

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void fmt::v8::detail::value<fmt::v8::basic_format_context<fmt::v8::appender,char>>::
     format_custom_arg<spdlog::stopwatch,fmt::v8::formatter<spdlog::stopwatch,char,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<fmt::v8::appender,_char> *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  iterator pcVar3;
  iterator iVar4;
  formatter<spdlog::stopwatch,_char,_void> f;
  dynamic_format_specs<char> local_60;
  
  dynamic_format_specs<char>::dynamic_format_specs(&local_60);
  pcVar3 = formatter<double,char,void>::
           parse<fmt::v8::basic_format_parse_context<char,fmt::v8::detail::error_handler>>
                     ((formatter<double,char,void> *)&local_60,parse_ctx);
  pcVar2 = (parse_ctx->format_str_).data_;
  (parse_ctx->format_str_).data_ = pcVar3;
  psVar1 = &(parse_ctx->format_str_).size_;
  *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)pcVar3));
  iVar4 = formatter<spdlog::stopwatch,char,void>::
          format<fmt::v8::basic_format_context<fmt::v8::appender,char>>
                    ((formatter<spdlog::stopwatch,char,void> *)&local_60,(stopwatch *)arg,ctx);
  (ctx->out_).super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
       (buffer<char> *)iVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  return;
}

Assistant:

static void format_custom_arg(const void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    Formatter f;
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }